

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_button_text_styled(nk_context *ctx,nk_style_button *style,char *title,int len)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_widget_layout_states nVar3;
  nk_context *local_70;
  undefined1 auStack_60 [4];
  nk_widget_layout_states state;
  nk_rect bounds;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  int len_local;
  char *title_local;
  nk_style_button *style_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x50b6,
                  "int nk_button_text_styled(struct nk_context *, const struct nk_style_button *, const char *, int)"
                 );
  }
  if (style == (nk_style_button *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x50b7,
                  "int nk_button_text_styled(struct nk_context *, const struct nk_style_button *, const char *, int)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x50b8,
                  "int nk_button_text_styled(struct nk_context *, const struct nk_style_button *, const char *, int)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x50b9,
                  "int nk_button_text_styled(struct nk_context *, const struct nk_style_button *, const char *, int)"
                 );
  }
  if ((((style == (nk_style_button *)0x0) || (ctx == (nk_context *)0x0)) ||
      (ctx->current == (nk_window *)0x0)) || (ctx->current->layout == (nk_panel *)0x0)) {
    ctx_local._4_4_ = 0;
  }
  else {
    pnVar1 = ctx->current;
    pnVar2 = pnVar1->layout;
    nVar3 = nk_widget((nk_rect *)auStack_60,ctx);
    if (nVar3 == NK_WIDGET_INVALID) {
      ctx_local._4_4_ = 0;
    }
    else {
      if ((nVar3 == NK_WIDGET_ROM) || (local_70 = ctx, (pnVar2->flags & 0x1000) != 0)) {
        local_70 = (nk_context *)0x0;
      }
      bounds._8_8_ = local_70;
      ctx_local._4_4_ =
           nk_do_button_text(&ctx->last_widget_state,&pnVar1->buffer,_auStack_60,title,len,
                             style->text_alignment,ctx->button_behavior,style,&local_70->input,
                             (ctx->style).font);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_button_text_styled(struct nk_context *ctx,
    const struct nk_style_button *style, const char *title, int len)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;

    struct nk_rect bounds;
    enum nk_widget_layout_states state;

    NK_ASSERT(ctx);
    NK_ASSERT(style);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!style || !ctx || !ctx->current || !ctx->current->layout) return 0;

    win = ctx->current;
    layout = win->layout;
    state = nk_widget(&bounds, ctx);

    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_button_text(&ctx->last_widget_state, &win->buffer, bounds,
                    title, len, style->text_alignment, ctx->button_behavior,
                    style, in, ctx->style.font);
}